

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonChain.cpp
# Opt level: O2

int64_t __thiscall xmrig::JsonChain::getInt64(JsonChain *this,char *key,int64_t defaultValue)

{
  pointer this_00;
  pointer pGVar1;
  pointer pGVar2;
  ConstMemberIterator CVar3;
  pointer pGVar4;
  
  pGVar4 = (this->m_chain).
           super__Vector_base<rapidjson::GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>,_std::allocator<rapidjson::GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pGVar4 == (this->m_chain).
                  super__Vector_base<rapidjson::GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>,_std::allocator<rapidjson::GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
      return defaultValue;
    }
    this_00 = pGVar4 + -1;
    CVar3 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::FindMember(&this_00->
                          super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         ,key);
    pGVar2 = pGVar4 + -1;
    pGVar1 = pGVar4 + -1;
    pGVar4 = this_00;
  } while ((CVar3.ptr_ ==
            (Pointer)((ulong)(pGVar1->
                             super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                             ).data_.s.length * 0x20 +
                     ((ulong)(pGVar2->
                             super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                             ).data_.s.str & 0xffffffffffff))) ||
          ((undefined1  [16])
           ((undefined1  [16])((CVar3.ptr_)->value).data_ & (undefined1  [16])0x80000000000000) ==
           (undefined1  [16])0x0));
  return ((CVar3.ptr_)->value).data_.n.i64;
}

Assistant:

int64_t xmrig::JsonChain::getInt64(const char *key, int64_t defaultValue) const
{
    for (auto it = m_chain.rbegin(); it != m_chain.rend(); ++it) {
        auto i = it->FindMember(key);
        if (i != it->MemberEnd() && i->value.IsInt64()) {
            return i->value.GetInt64();
        }
    }

    return defaultValue;
}